

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O2

type dlib::
     matrix_assign_default<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
               (assignable_ptr_matrix<float> *dest,
               matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>
               *src,type alpha,bool add_to)

{
  undefined1 auVar1 [16];
  long lVar2;
  matrix_op<dlib::op_pointer_to_mat<float>_> *pmVar3;
  undefined7 in_register_00000011;
  long c;
  long lVar4;
  long lVar5;
  long r;
  long lVar6;
  const_ret_type cVar7;
  undefined1 auVar8 [64];
  undefined1 extraout_var [60];
  
  if ((int)CONCAT71(in_register_00000011,add_to) == 0) {
    pmVar3 = ((src->op).m1)->lhs;
    if ((alpha != 1.0) || (NAN(alpha))) {
      lVar5 = 0;
      for (lVar6 = 0; lVar6 < (pmVar3->op).rows; lVar6 = lVar6 + 1) {
        for (lVar4 = 0; lVar4 < (pmVar3->op).cols; lVar4 = lVar4 + 1) {
          cVar7 = op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                  ::apply(&src->op,lVar6,lVar4);
          *(float *)((long)dest->ptr + lVar4 * 4 + dest->width * lVar5) = cVar7 * alpha;
          pmVar3 = ((src->op).m1)->lhs;
        }
        lVar5 = lVar5 + 4;
      }
    }
    else {
      lVar5 = 0;
      for (lVar6 = 0; lVar6 < (pmVar3->op).rows; lVar6 = lVar6 + 1) {
        for (lVar4 = 0; lVar4 < (pmVar3->op).cols; lVar4 = lVar4 + 1) {
          cVar7 = op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                  ::apply(&src->op,lVar6,lVar4);
          *(const_ret_type *)((long)dest->ptr + lVar4 * 4 + dest->width * lVar5) = cVar7;
          pmVar3 = ((src->op).m1)->lhs;
        }
        lVar5 = lVar5 + 4;
      }
    }
  }
  else if ((alpha != 1.0) || (NAN(alpha))) {
    pmVar3 = ((src->op).m1)->lhs;
    if ((alpha != -1.0) || (NAN(alpha))) {
      lVar5 = 0;
      for (lVar6 = 0; lVar6 < (pmVar3->op).rows; lVar6 = lVar6 + 1) {
        for (lVar4 = 0; lVar4 < (pmVar3->op).cols; lVar4 = lVar4 + 1) {
          auVar8._0_4_ = op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                         ::apply(&src->op,lVar6,lVar4);
          auVar8._4_60_ = extraout_var;
          lVar2 = dest->width * lVar5;
          auVar1 = vfmadd213ss_fma(auVar8._0_16_,ZEXT416((uint)alpha),
                                   ZEXT416(*(uint *)((long)dest->ptr + lVar4 * 4 + lVar2)));
          *(int *)((long)dest->ptr + lVar4 * 4 + lVar2) = auVar1._0_4_;
          pmVar3 = ((src->op).m1)->lhs;
        }
        lVar5 = lVar5 + 4;
      }
    }
    else {
      lVar5 = 0;
      for (lVar6 = 0; lVar6 < (pmVar3->op).rows; lVar6 = lVar6 + 1) {
        for (lVar4 = 0; lVar4 < (pmVar3->op).cols; lVar4 = lVar4 + 1) {
          cVar7 = op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                  ::apply(&src->op,lVar6,lVar4);
          lVar2 = dest->width * lVar5;
          *(float *)((long)dest->ptr + lVar4 * 4 + lVar2) =
               *(float *)((long)dest->ptr + lVar4 * 4 + lVar2) - cVar7;
          pmVar3 = ((src->op).m1)->lhs;
        }
        lVar5 = lVar5 + 4;
      }
    }
  }
  else {
    lVar5 = 0;
    pmVar3 = ((src->op).m1)->lhs;
    for (lVar6 = 0; lVar6 < (pmVar3->op).rows; lVar6 = lVar6 + 1) {
      for (lVar4 = 0; lVar4 < (pmVar3->op).cols; lVar4 = lVar4 + 1) {
        cVar7 = op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                ::apply(&src->op,lVar6,lVar4);
        lVar2 = dest->width * lVar5;
        *(float *)((long)dest->ptr + lVar4 * 4 + lVar2) =
             cVar7 + *(float *)((long)dest->ptr + lVar4 * 4 + lVar2);
        pmVar3 = ((src->op).m1)->lhs;
      }
      lVar5 = lVar5 + 4;
    }
  }
  return;
}

Assistant:

inline typename disable_if<ma::has_column_major_layout<EXP1> >::type  
    matrix_assign_default (
        EXP1& dest,
        const EXP2& src,
        typename EXP2::type alpha,
        bool add_to
    )
    /*!
        requires
            - src.destructively_aliases(dest) == false
            - dest.nr() == src.nr()
            - dest.nc() == src.nc()
        ensures
            - if (add_to == false) then
                - #dest == alpha*src
            - else
                - #dest == dest + alpha*src
    !*/
    {
        if (add_to)
        {
            if (alpha == static_cast<typename EXP2::type>(1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) += src(r,c);
                    }
                }
            }
            else if (alpha == static_cast<typename EXP2::type>(-1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) -= src(r,c);
                    }
                }
            }
            else
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) += alpha*src(r,c);
                    }
                }
            }
        }
        else
        {
            if (alpha == static_cast<typename EXP2::type>(1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) = src(r,c);
                    }
                }
            }
            else
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) = alpha*src(r,c);
                    }
                }
            }
        }
    }